

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::encryption_handler::switch_send_crypto
          (encryption_handler *this,shared_ptr<libtorrent::crypto_plugin> *crypto,
          int pending_encryption)

{
  _List_iterator<libtorrent::aux::encryption_handler::barrier> _Var1;
  element_type *peVar2;
  encryption_handler *peVar3;
  bool bVar4;
  __shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  value_type local_38;
  
  if ((encryption_handler *)
      (this->m_send_barriers).
      super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
      ._M_impl._M_node.super__List_node_base._M_next == this) {
    peVar2 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar4 = peVar2 != (element_type *)0x0;
  }
  else {
    _Var1 = ::std::prev<std::_List_iterator<libtorrent::aux::encryption_handler::barrier>>
                      ((_List_iterator<libtorrent::aux::encryption_handler::barrier>)this,1);
    peVar3 = this;
    while (peVar3 = (encryption_handler *)
                    (peVar3->m_send_barriers).
                    super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
          peVar3 != (encryption_handler *)_Var1._M_node) {
      pending_encryption =
           pending_encryption -
           *(int *)&(peVar3->m_dec_handler).
                    super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    *(int *)&(this->m_send_barriers).
             super__List_base<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             ._M_impl._M_node.super__List_node_base._M_prev[2]._M_next = pending_encryption;
    peVar2 = (crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    bVar4 = false;
  }
  if (peVar2 != (element_type *)0x0) {
    ::std::__shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_48,
               &crypto->super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
               &_Stack_48);
    local_38.next = 0x7fffffff;
    ::std::__cxx11::
    list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
    ::push_back(&this->m_send_barriers,&local_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.enc_handler.
                super___shared_ptr<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  }
  return bVar4;
}

Assistant:

bool encryption_handler::switch_send_crypto(std::shared_ptr<crypto_plugin> crypto
		, int pending_encryption)
	{
		bool place_barrier = false;
		if (!m_send_barriers.empty())
		{
			auto const end = std::prev(m_send_barriers.end());
			for (auto b = m_send_barriers.begin(); b != end; ++b)
				pending_encryption -= b->next;
			TORRENT_ASSERT(pending_encryption >= 0);
			m_send_barriers.back().next = pending_encryption;
		}
		else if (crypto)
			place_barrier = true;

		if (crypto)
			m_send_barriers.push_back(barrier(crypto, INT_MAX));

		return place_barrier;
	}